

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O0

vector<cali::Attribute,_std::allocator<cali::Attribute>_> * __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::get_attributes
          (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__return_storage_ptr__,
          CaliperMetadataDBImpl *this)

{
  bool bVar1;
  size_type __n;
  reference ppVar2;
  value_type local_80;
  undefined1 local_78 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
  it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>_>
  *__range1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> g;
  CaliperMetadataDBImpl *this_local;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> *ret;
  
  g._M_device = (mutex_type *)this;
  ::std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)&this->m_attribute_lock);
  ::std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::vector
            ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)__return_storage_ptr__);
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>_>
        ::size(&this->m_attributes);
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>_>
           ::begin(&this->m_attributes);
  it.second = (Node *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>_>
                      ::end(&this->m_attributes);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&it.second), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
            *)local_78,ppVar2);
    local_80.m_node = (Node *)Attribute::make_attribute((Node *)it.first.field_2._8_8_);
    std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::push_back
              (__return_storage_ptr__,&local_80);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>
             *)local_78);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>
    ::operator++(&__end1);
  }
  ::std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Attribute> get_attributes() const
    {
        std::lock_guard<std::mutex> g(m_attribute_lock);

        std::vector<Attribute> ret;
        ret.reserve(m_attributes.size());

        for (auto it : m_attributes)
            ret.push_back(Attribute::make_attribute(it.second));

        return ret;
    }